

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O0

int64_t secp256k1_modinv64_divsteps_62_var
                  (int64_t eta,uint64_t f0,uint64_t g0,secp256k1_modinv64_trans2x2 *t)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  long *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint64_t tmp;
  int zeros;
  int limit;
  int i;
  uint32_t w;
  uint64_t m;
  uint64_t g;
  uint64_t f;
  uint64_t r;
  uint64_t q;
  uint64_t v;
  uint64_t u;
  int local_78;
  int local_74;
  int local_60;
  uint local_5c;
  ulong local_50;
  ulong local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_8;
  
  local_28 = 1;
  local_30 = 0;
  local_38 = 0;
  local_40 = 1;
  local_60 = 0x3e;
  local_50 = in_RDX;
  local_48 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    iVar1 = secp256k1_ctz64_var(local_50 | -1L << ((byte)local_60 & 0x3f));
    bVar5 = (byte)iVar1;
    uVar2 = local_50 >> (bVar5 & 0x3f);
    lVar3 = local_28 << (bVar5 & 0x3f);
    lVar4 = local_30 << (bVar5 & 0x3f);
    local_8 = local_8 - iVar1;
    local_60 = local_60 - iVar1;
    if (local_60 == 0) break;
    iVar1 = (int)uVar2;
    if (local_8 < 0) {
      local_8 = -local_8;
      local_28 = local_38;
      local_38 = -lVar3;
      local_30 = local_40;
      local_40 = -lVar4;
      local_74 = local_60;
      if ((int)local_8 + 1 <= local_60) {
        local_74 = (int)local_8 + 1;
      }
      local_5c = iVar1 * (int)-local_48 * (iVar1 * iVar1 + -2) &
                 (uint)(0xffffffffffffffff >> (0x40U - (char)local_74 & 0x3f)) & 0x3f;
      local_50 = -local_48;
      local_48 = uVar2;
    }
    else {
      local_78 = local_60;
      if ((int)local_8 + 1 <= local_60) {
        local_78 = (int)local_8 + 1;
      }
      local_5c = -((int)local_48 + ((int)local_48 + 1U & 4) * 2) * iVar1 &
                 (uint)(0xffffffffffffffff >> (0x40U - (char)local_78 & 0x3f)) & 0xf;
      local_50 = uVar2;
      local_30 = lVar4;
      local_28 = lVar3;
    }
    local_50 = local_48 * local_5c + local_50;
    local_38 = local_28 * (ulong)local_5c + local_38;
    local_40 = local_30 * (ulong)local_5c + local_40;
  }
  *in_RCX = lVar3;
  in_RCX[1] = lVar4;
  in_RCX[2] = local_38;
  in_RCX[3] = local_40;
  return local_8;
}

Assistant:

static int64_t secp256k1_modinv64_divsteps_62_var(int64_t eta, uint64_t f0, uint64_t g0, secp256k1_modinv64_trans2x2 *t) {
    /* Transformation matrix; see comments in secp256k1_modinv64_divsteps_62. */
    uint64_t u = 1, v = 0, q = 0, r = 1;
    uint64_t f = f0, g = g0, m;
    uint32_t w;
    int i = 62, limit, zeros;

    for (;;) {
        /* Use a sentinel bit to count zeros only up to i. */
        zeros = secp256k1_ctz64_var(g | (UINT64_MAX << i));
        /* Perform zeros divsteps at once; they all just divide g by two. */
        g >>= zeros;
        u <<= zeros;
        v <<= zeros;
        eta -= zeros;
        i -= zeros;
        /* We're done once we've done 62 divsteps. */
        if (i == 0) break;
        VERIFY_CHECK((f & 1) == 1);
        VERIFY_CHECK((g & 1) == 1);
        VERIFY_CHECK((u * f0 + v * g0) == f << (62 - i));
        VERIFY_CHECK((q * f0 + r * g0) == g << (62 - i));
        /* Bounds on eta that follow from the bounds on iteration count (max 12*62 divsteps). */
        VERIFY_CHECK(eta >= -745 && eta <= 745);
        /* If eta is negative, negate it and replace f,g with g,-f. */
        if (eta < 0) {
            uint64_t tmp;
            eta = -eta;
            tmp = f; f = g; g = -tmp;
            tmp = u; u = q; q = -tmp;
            tmp = v; v = r; r = -tmp;
            /* Use a formula to cancel out up to 6 bits of g. Also, no more than i can be cancelled
             * out (as we'd be done before that point), and no more than eta+1 can be done as its
             * sign will flip again once that happens. */
            limit = ((int)eta + 1) > i ? i : ((int)eta + 1);
            VERIFY_CHECK(limit > 0 && limit <= 62);
            /* m is a mask for the bottom min(limit, 6) bits. */
            m = (UINT64_MAX >> (64 - limit)) & 63U;
            /* Find what multiple of f must be added to g to cancel its bottom min(limit, 6)
             * bits. */
            w = (f * g * (f * f - 2)) & m;
        } else {
            /* In this branch, use a simpler formula that only lets us cancel up to 4 bits of g, as
             * eta tends to be smaller here. */
            limit = ((int)eta + 1) > i ? i : ((int)eta + 1);
            VERIFY_CHECK(limit > 0 && limit <= 62);
            /* m is a mask for the bottom min(limit, 4) bits. */
            m = (UINT64_MAX >> (64 - limit)) & 15U;
            /* Find what multiple of f must be added to g to cancel its bottom min(limit, 4)
             * bits. */
            w = f + (((f + 1) & 4) << 1);
            w = (-w * g) & m;
        }
        g += f * w;
        q += u * w;
        r += v * w;
        VERIFY_CHECK((g & m) == 0);
    }
    /* Return data in t and return value. */
    t->u = (int64_t)u;
    t->v = (int64_t)v;
    t->q = (int64_t)q;
    t->r = (int64_t)r;

    /* The determinant of t must be a power of two. This guarantees that multiplication with t
     * does not change the gcd of f and g, apart from adding a power-of-2 factor to it (which
     * will be divided out again). As each divstep's individual matrix has determinant 2, the
     * aggregate of 62 of them will have determinant 2^62. */
    VERIFY_CHECK(secp256k1_modinv64_det_check_pow2(t, 62, 0));

    return eta;
}